

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMimeGlobPattern>::reallocate
          (QMovableArrayOps<QMimeGlobPattern> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QMimeGlobPattern>_*,_QMimeGlobPattern_*> pVar1;
  
  pVar1 = QTypedArrayData<QMimeGlobPattern>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QMimeGlobPattern>).
                     super_QArrayDataPointer<QMimeGlobPattern>.d,
                     (this->super_QGenericArrayOps<QMimeGlobPattern>).
                     super_QArrayDataPointer<QMimeGlobPattern>.ptr,alloc,option);
  if (pVar1.second != (QMimeGlobPattern *)0x0) {
    (this->super_QGenericArrayOps<QMimeGlobPattern>).super_QArrayDataPointer<QMimeGlobPattern>.d =
         pVar1.first;
    (this->super_QGenericArrayOps<QMimeGlobPattern>).super_QArrayDataPointer<QMimeGlobPattern>.ptr =
         pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }